

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_> uVar1;
  bool bVar2;
  ostream *poVar3;
  punct_facet *this;
  long lVar4;
  char *pcVar5;
  char *request_uri;
  Statement *pSVar6;
  ostream *extraout_RAX;
  socklen_t __len;
  int aIndex;
  string *this_00;
  ulong uVar7;
  double dVar8;
  unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_> query;
  string local_4b8;
  ostream *local_498;
  allocator<char> local_48e;
  allocator<char> local_48d;
  undefined4 local_48c;
  Database db;
  string local_460;
  locale local_440;
  HttpHandler http;
  string local_398;
  double maxTemp [4];
  double minTemp [4];
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  for (uVar7 = 1; uVar7 < (ulong)(long)argc; uVar7 = uVar7 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&http,argv[uVar7],(allocator<char> *)&db);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &http,"-v");
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&http,"--version"), bVar2)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"vbus-server ");
      GitMetadata::Version_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,(string *)&db);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&db);
      std::__cxx11::string::~string((string *)&http);
      return 0;
    }
    std::__cxx11::string::~string((string *)&http);
  }
  std::locale::locale((locale *)&db,
                      (locale *)(std::ostream::_M_insert<double> + *(long *)(std::cout + -0x18)));
  this = (punct_facet *)operator_new(0x18);
  *(undefined8 *)this = 0;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  punct_facet::punct_facet(this);
  std::locale::locale<punct_facet>((locale *)&http,(locale *)&db,this);
  std::ios::imbue(&local_440);
  std::locale::~locale(&local_440);
  std::locale::~locale((locale *)&http);
  std::locale::~locale((locale *)&db);
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)minTemp + lVar4) = 0x7ff0000000000000;
  }
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)maxTemp + lVar4) = 0xfff0000000000000;
  }
  pcVar5 = getenv("HTTP_ACCEPT_ENCODING");
  request_uri = getenv("REQUEST_URI");
  HttpHandler::HttpHandler(&http,pcVar5,request_uri,(ostream *)&std::cout);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"timespan",(allocator<char> *)&db);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"-1 hour",(allocator<char> *)&local_4b8);
  HttpHandler::setDefault(&http,&local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"format",(allocator<char> *)&db);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"csv",(allocator<char> *)&local_4b8);
  HttpHandler::setDefault(&http,&local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"start",(allocator<char> *)&db);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"now",(allocator<char> *)&local_4b8);
  HttpHandler::setDefault(&http,&local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"clip",(allocator<char> *)&db);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"0",(allocator<char> *)&local_4b8);
  HttpHandler::setDefault(&http,&local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"format",(allocator<char> *)&local_4b8);
  HttpHandler::param((string *)&db,&http,&local_190);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db,
                          "csv");
  std::__cxx11::string::~string((string *)&db);
  std::__cxx11::string::~string((string *)&local_190);
  if (bVar2) {
    pcVar5 = "text/comma-separated-values";
LAB_00117c3b:
    HttpHandler::setContentType(&http,pcVar5);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"format",(allocator<char> *)&local_4b8);
    HttpHandler::param((string *)&db,&http,&local_1b0);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&db
                            ,"json");
    std::__cxx11::string::~string((string *)&db);
    std::__cxx11::string::~string((string *)&local_1b0);
    if (bVar2) {
      pcVar5 = "application/json";
      goto LAB_00117c3b;
    }
  }
  HttpHandler::sendHeader(&http);
  local_498 = HttpHandler::getStream(&http);
  __len = 0;
  SQLite::Database::Database(&db,"/srv/http/data/vbus.sqlite",1,0,(char *)0x0);
  SQLite::Database::setBusyTimeout(&db,3000);
  query._M_t.super___uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>._M_t.
  super__Tuple_impl<0UL,_SQLite::Statement_*,_std::default_delete<SQLite::Statement>_>.
  super__Head_base<0UL,_SQLite::Statement_*,_false>._M_head_impl =
       (__uniq_ptr_data<SQLite::Statement,_std::default_delete<SQLite::Statement>,_true,_true>)
       (__uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"timespan",(allocator<char> *)&local_460);
  HttpHandler::param(&local_4b8,&http,&local_1d0);
  bVar2 = std::operator==(&local_4b8,"single");
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_1d0);
  if (bVar2) {
    pSVar6 = (Statement *)operator_new(0x70);
    SQLite::Statement::Statement
              (pSVar6,&db,
               "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data ORDER BY id DESC LIMIT 1"
              );
LAB_00117da4:
    std::__uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::reset
              ((__uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_> *)&query
               ,pSVar6);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"timespan",(allocator<char> *)&local_460);
    HttpHandler::param(&local_4b8,&http,&local_1f0);
    bVar2 = std::operator==(&local_4b8,"current");
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_1f0);
    if (bVar2) {
      pSVar6 = (Statement *)operator_new(0x70);
      SQLite::Statement::Statement
                (pSVar6,&db,
                 "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data WHERE time > (SELECT DATETIME(\'now\', \'-5 minutes\')) ORDER BY id DESC LIMIT 1"
                );
      goto LAB_00117da4;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"start",(allocator<char> *)&local_460);
    HttpHandler::param(&local_4b8,&http,&local_210);
    bVar2 = std::operator==(&local_4b8,"now");
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_210);
    if (bVar2) {
      pSVar6 = (Statement *)operator_new(0x70);
      SQLite::Statement::Statement
                (pSVar6,&db,
                 "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data WHERE time > (SELECT DATETIME(\'now\', ?)) ORDER BY time"
                );
      std::__uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::reset
                ((__uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_> *)
                 &query,pSVar6);
      uVar1 = query;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"timespan",(allocator<char> *)&local_460);
      HttpHandler::param(&local_4b8,&http,&local_290);
      SQLite::Statement::bind
                ((Statement *)
                 uVar1._M_t.
                 super___uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_SQLite::Statement_*,_std::default_delete<SQLite::Statement>_>
                 .super__Head_base<0UL,_SQLite::Statement_*,_false>._M_head_impl,1,
                 (sockaddr *)&local_4b8,__len);
      std::__cxx11::string::~string((string *)&local_4b8);
      this_00 = &local_290;
    }
    else {
      pSVar6 = (Statement *)operator_new(0x70);
      SQLite::Statement::Statement
                (pSVar6,&db,
                 "SELECT datetime(time, \'localtime\') as time, temp1, temp2, temp3, temp4, pump1, pump2 FROM data WHERE time > (SELECT DATETIME(?, \'utc\')) AND time < (SELECT DATETIME(?, \'utc\', ?)) ORDER BY time"
                );
      std::__uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::reset
                ((__uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_> *)
                 &query,pSVar6);
      uVar1 = query;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"start",(allocator<char> *)&local_460);
      HttpHandler::param(&local_4b8,&http,&local_230);
      SQLite::Statement::bind
                ((Statement *)
                 uVar1._M_t.
                 super___uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_SQLite::Statement_*,_std::default_delete<SQLite::Statement>_>
                 .super__Head_base<0UL,_SQLite::Statement_*,_false>._M_head_impl,1,
                 (sockaddr *)&local_4b8,__len);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_230);
      uVar1 = query;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"start",(allocator<char> *)&local_460);
      HttpHandler::param(&local_4b8,&http,&local_250);
      SQLite::Statement::bind
                ((Statement *)
                 uVar1._M_t.
                 super___uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_SQLite::Statement_*,_std::default_delete<SQLite::Statement>_>
                 .super__Head_base<0UL,_SQLite::Statement_*,_false>._M_head_impl,2,
                 (sockaddr *)&local_4b8,__len);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_250);
      uVar1 = query;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"timespan",(allocator<char> *)&local_460);
      HttpHandler::param(&local_4b8,&http,&local_270);
      SQLite::Statement::bind
                ((Statement *)
                 uVar1._M_t.
                 super___uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_SQLite::Statement_*,_std::default_delete<SQLite::Statement>_>
                 .super__Head_base<0UL,_SQLite::Statement_*,_false>._M_head_impl,3,
                 (sockaddr *)&local_4b8,__len);
      std::__cxx11::string::~string((string *)&local_4b8);
      this_00 = &local_270;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"format",(allocator<char> *)&local_460);
  HttpHandler::param(&local_4b8,&http,&local_2b0);
  bVar2 = std::operator==(&local_4b8,"csv");
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_2b0);
  if (bVar2) {
    pcVar5 = "Datum,Ofen,Speicher-unten,Speicher-oben,Heizung,Ventil-Ofen,Ventil-Heizung";
LAB_001180c9:
    poVar3 = std::operator<<(local_498,pcVar5);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"format",(allocator<char> *)&local_460);
    HttpHandler::param(&local_4b8,&http,&local_2d0);
    bVar2 = std::operator==(&local_4b8,"json");
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_2d0);
    poVar3 = extraout_RAX;
    if (bVar2) {
      pcVar5 = "{\"data\":[";
      goto LAB_001180c9;
    }
  }
  local_48c = (undefined4)CONCAT71((int7)((ulong)poVar3 >> 8),1);
  while (bVar2 = SQLite::Statement::executeStep
                           ((Statement *)
                            query._M_t.
                            super___uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SQLite::Statement_*,_std::default_delete<SQLite::Statement>_>
                            .super__Head_base<0UL,_SQLite::Statement_*,_false>._M_head_impl), bVar2)
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"format",(allocator<char> *)&local_460);
    HttpHandler::param(&local_4b8,&http,&local_50);
    bVar2 = std::operator==(&local_4b8,"csv");
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_50);
    uVar1 = query;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"clip",(allocator<char> *)&local_460);
      HttpHandler::param(&local_4b8,&http,&local_2f0);
      bVar2 = std::operator==(&local_4b8,"1");
      printCsvResult((Statement *)
                     uVar1._M_t.
                     super___uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_SQLite::Statement_*,_std::default_delete<SQLite::Statement>_>
                     .super__Head_base<0UL,_SQLite::Statement_*,_false>._M_head_impl,local_498,false
                     ,bVar2);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_2f0);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"format",(allocator<char> *)&local_460);
      HttpHandler::param(&local_4b8,&http,&local_70);
      bVar2 = std::operator==(&local_4b8,"json");
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar2) {
        printJsonResult((Statement *)
                        query._M_t.
                        super___uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SQLite::Statement_*,_std::default_delete<SQLite::Statement>_>
                        .super__Head_base<0UL,_SQLite::Statement_*,_false>._M_head_impl,local_498,
                        (bool)((byte)local_48c & 1));
      }
    }
    lVar4 = 0;
    while (lVar4 != 4) {
      aIndex = (int)(lVar4 + 1);
      SQLite::Statement::getColumn
                ((Column *)&local_4b8,
                 (Statement *)
                 query._M_t.
                 super___uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_SQLite::Statement_*,_std::default_delete<SQLite::Statement>_>
                 .super__Head_base<0UL,_SQLite::Statement_*,_false>._M_head_impl,aIndex);
      dVar8 = SQLite::Column::getDouble((Column *)&local_4b8);
      if (minTemp[lVar4] <= dVar8) {
        dVar8 = minTemp[lVar4];
      }
      minTemp[lVar4] = dVar8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4b8._M_string_length);
      SQLite::Statement::getColumn
                ((Column *)&local_4b8,
                 (Statement *)
                 query._M_t.
                 super___uniq_ptr_impl<SQLite::Statement,_std::default_delete<SQLite::Statement>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_SQLite::Statement_*,_std::default_delete<SQLite::Statement>_>
                 .super__Head_base<0UL,_SQLite::Statement_*,_false>._M_head_impl,aIndex);
      dVar8 = SQLite::Column::getDouble((Column *)&local_4b8);
      if (dVar8 <= maxTemp[lVar4]) {
        dVar8 = maxTemp[lVar4];
      }
      maxTemp[lVar4] = dVar8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_4b8._M_string_length);
      lVar4 = lVar4 + 1;
    }
    local_48c = 0;
    HttpHandler::process(&http);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"format",(allocator<char> *)&local_460);
  HttpHandler::param(&local_4b8,&http,&local_310);
  bVar2 = std::operator==(&local_4b8,"json");
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_310);
  if (!bVar2) goto LAB_0011850b;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"timespan",&local_48d);
  HttpHandler::param(&local_4b8,&http,&local_398);
  bVar2 = std::operator==(&local_4b8,"single");
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_398);
LAB_0011841e:
    poVar3 = std::endl<char,std::char_traits<char>>(local_498);
    poVar3 = std::operator<<(poVar3,"]}");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"timespan",&local_48e);
    HttpHandler::param(&local_460,&http,&local_330);
    bVar2 = std::operator==(&local_460,"current");
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_398);
    if (bVar2) goto LAB_0011841e;
    poVar3 = std::endl<char,std::char_traits<char>>(local_498);
    std::operator<<(poVar3,"]");
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      poVar3 = std::operator<<(local_498,",\"temp");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(int)lVar4 + 1);
      std::operator<<(poVar3,"\": {\"min\": ");
      poVar3 = std::ostream::_M_insert<double>(minTemp[lVar4]);
      std::operator<<(poVar3,", \"max\": ");
      poVar3 = std::ostream::_M_insert<double>(maxTemp[lVar4]);
      poVar3 = std::operator<<(poVar3,"}");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::operator<<(local_498,"}");
  }
  HttpHandler::process(&http);
LAB_0011850b:
  HttpHandler::flush(&http);
  std::unique_ptr<SQLite::Statement,_std::default_delete<SQLite::Statement>_>::~unique_ptr(&query);
  SQLite::Database::~Database(&db);
  HttpHandler::~HttpHandler(&http);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    for (size_t idx = 1; idx < argc; idx++)
    {
        auto arg = std::string(argv[idx]);
        if (arg == "-v" || arg == "--version")
        {
            std::cout << "vbus-server " << GitMetadata::Version() << std::endl;
            return 0;
        }
    }
    
    // Set decimal seperator to '.'
    std::cout.imbue(std::locale(std::cout.getloc(), new punct_facet()));

    double minTemp[4];
    double maxTemp[4];
    std::fill_n(minTemp, 4,  std::numeric_limits<double>::infinity());
    std::fill_n(maxTemp, 4, -std::numeric_limits<double>::infinity());

    // Get HTTP handler and set default paramter
    HttpHandler http(std::getenv("HTTP_ACCEPT_ENCODING"), std::getenv("REQUEST_URI"), std::cout);
    http.setDefault("timespan", "-1 hour");
    http.setDefault("format", "csv");
    http.setDefault("start", "now");
    http.setDefault("clip", "0");

    // Print HTTP header
    if (http.param("format") == "csv")
    {
        http.setContentType("text/comma-separated-values");
    }
    else if (http.param("format") == "json")
    {
        http.setContentType("application/json");
    }

    http.sendHeader();
    auto outputStream = http.getStream();

    try
    {
        SQLite::Database db(DB_PATH);
        db.setBusyTimeout(3000);

        // Build sqlite query
        std::unique_ptr<SQLite::Statement> query;

        if (http.param("timespan") == "single")
        {
            query.reset(new SQLite::Statement(db, SELECT_SINGLE));
        }
        else if (http.param("timespan") == "current")
        {
            query.reset(new SQLite::Statement(db, SELECT_CURRENT));

        }
        else
        {
            if (http.param("start") != "now")
            {
                query.reset(new SQLite::Statement(db, SELECT_TIMESPAN_RANGE));
                query->bind(1, http.param("start"));
                query->bind(2, http.param("start"));
                query->bind(3, http.param("timespan"));
            }
            else
            {
                query.reset(new SQLite::Statement(db, SELECT_TIMESPAN));
                query->bind(1, http.param("timespan"));
            }
        }

        if (http.param("format") == "csv")
        {
            *outputStream << CSV_HEADER << std::endl;
        }
        else if (http.param("format") == "json")
        {
            *outputStream << "{\"data\":[" << std::endl;
        }

        bool isFirstRow = true;

        while (query->executeStep())
        {
            if (http.param("format") == "csv")
            {
                printCsvResult(*query, *outputStream, isFirstRow, http.param("clip") == "1");
            }
            else if (http.param("format") == "json")
            {
                printJsonResult(*query, *outputStream, isFirstRow);
            }

            // Update min/max stats
            for (int idx=0; idx<4; idx++)
            {
                minTemp[idx] = std::min(minTemp[idx], query->getColumn(idx+1).getDouble());
                maxTemp[idx] = std::max(maxTemp[idx], query->getColumn(idx+1).getDouble());
            }

            http.process();

            isFirstRow = false;
        }

        // Add min/max stats to json response
        if (http.param("format") == "json")
        {
            if (http.param("timespan") == "single" || http.param("timespan") == "current")
            {
                *outputStream << std::endl << "]}" << std::endl;
            }
            else
            {
                *outputStream << std::endl << "]";

                for (int idx=0; idx<4; idx++)
                {
                    *outputStream << ",\"temp" << idx+1 << "\": {\"min\": " << minTemp[idx] << ", \"max\": " << maxTemp[idx] << "}" << std::endl;
                }

                *outputStream << "}";
            }

            http.process();
        }

        http.flush();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << std::endl;
        return 1;
    }

    return 0;
}